

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O0

bool __thiscall
cmVariableWatch::AddWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data,
          DeleteData delete_data)

{
  Pair *pPVar1;
  mapped_type *this_00;
  reference ppPVar2;
  Pair *pair;
  size_type cc;
  VectorOfPairs *vp;
  Pair *local_40;
  Pair *p;
  DeleteData delete_data_local;
  void *client_data_local;
  WatchMethod method_local;
  string *variable_local;
  cmVariableWatch *this_local;
  
  p = (Pair *)delete_data;
  delete_data_local = (DeleteData)client_data;
  client_data_local = method;
  method_local = (WatchMethod)variable;
  variable_local = (string *)this;
  pPVar1 = (Pair *)operator_new(0x18);
  Pair::Pair(pPVar1);
  pPVar1->Method = (WatchMethod)client_data_local;
  pPVar1->ClientData = delete_data_local;
  pPVar1->DeleteDataCall = (DeleteData)p;
  local_40 = pPVar1;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
            ::operator[](&this->WatchMap,(key_type *)method_local);
  pair = (Pair *)0x0;
  while( true ) {
    pPVar1 = (Pair *)std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>
                     ::size(this_00);
    if (pPVar1 <= pair) {
      std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>::push_back
                (this_00,&local_40);
      return true;
    }
    ppPVar2 = std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>::
              operator[](this_00,(size_type)pair);
    if ((((*ppPVar2)->Method == (WatchMethod)client_data_local) &&
        (delete_data_local != (DeleteData)0x0)) &&
       (delete_data_local == (DeleteData)(*ppPVar2)->ClientData)) break;
    pair = (Pair *)((long)&pair->Method + 1);
  }
  return false;
}

Assistant:

bool cmVariableWatch::AddWatch(const std::string& variable,
                               WatchMethod method, void* client_data /*=0*/,
                               DeleteData delete_data /*=0*/)
{
  cmVariableWatch::Pair* p = new cmVariableWatch::Pair;
  p->Method = method;
  p->ClientData = client_data;
  p->DeleteDataCall = delete_data;
  cmVariableWatch::VectorOfPairs* vp = &this->WatchMap[variable];
  cmVariableWatch::VectorOfPairs::size_type cc;
  for ( cc = 0; cc < vp->size(); cc ++ )
    {
    cmVariableWatch::Pair* pair = (*vp)[cc];
    if ( pair->Method == method &&
         client_data && client_data == pair->ClientData)
      {
      // Callback already exists
      return false;
      }
    }
  vp->push_back(p);
  return true;
}